

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall
cmGlobalGenerator::IsExcluded(cmGlobalGenerator *this,cmLocalGenerator *root,cmLocalGenerator *gen)

{
  cmLocalGenerator *root_00;
  bool bVar1;
  cmMakefile *this_00;
  cmLocalGenerator *gen_00;
  allocator local_49;
  string local_48;
  cmLocalGenerator *local_28;
  cmLocalGenerator *gen_local;
  cmLocalGenerator *root_local;
  cmGlobalGenerator *this_local;
  
  if ((gen == (cmLocalGenerator *)0x0) || (gen == root)) {
    this_local._7_1_ = false;
  }
  else {
    local_28 = gen;
    gen_local = root;
    root_local = (cmLocalGenerator *)this;
    this_00 = cmLocalGenerator::GetMakefile(gen);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,"EXCLUDE_FROM_ALL",&local_49);
    bVar1 = cmMakefile::GetPropertyAsBool(this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    root_00 = gen_local;
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      gen_00 = cmLocalGenerator::GetParent(local_28);
      this_local._7_1_ = IsExcluded(this,root_00,gen_00);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmGlobalGenerator::IsExcluded(cmLocalGenerator* root,
                                   cmLocalGenerator* gen) const
{
  if(!gen || gen == root)
    {
    // No directory excludes itself.
    return false;
    }

  if(gen->GetMakefile()->GetPropertyAsBool("EXCLUDE_FROM_ALL"))
    {
    // This directory is excluded from its parent.
    return true;
    }

  // This directory is included in its parent.  Check whether the
  // parent is excluded.
  return this->IsExcluded(root, gen->GetParent());
}